

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,ArrayAccessExpression *expression)

{
  NewScopeLayer *this_00;
  string local_58;
  Symbol local_38;
  ArrayAccessExpression *local_18;
  ArrayAccessExpression *expression_local;
  NewSymbolTreeVisitor *this_local;
  
  this_00 = this->current_layer_;
  local_18 = expression;
  expression_local = (ArrayAccessExpression *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)&expression->array_indent_);
  Symbol::Symbol(&local_38,&local_58);
  NewScopeLayer::GetArrayLayer(this_00,&local_38);
  Symbol::~Symbol(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  (**(local_18->index_expression_->super_Node)._vptr_Node)(local_18->index_expression_,this);
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(ArrayAccessExpression* expression) {
  current_layer_->GetArrayLayer(Symbol(expression->array_indent_));

  expression->index_expression_->Accept(this);
}